

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O2

uint32_t helper_neon_uqadd_s16_arm(CPUARMState *env,uint32_t a,uint32_t b)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  uVar4 = (b & 0xffff) + (int)(short)a;
  uVar1 = 0xffff;
  if ((int)uVar4 < 0x10000) {
    if ((int)uVar4 < 0) {
      uVar1 = 0;
      goto LAB_0053dd3a;
    }
  }
  else {
LAB_0053dd3a:
    uVar4 = uVar1;
    (env->vfp).qc[0] = 1;
  }
  iVar3 = (b >> 0x10) + ((int)a >> 0x10);
  iVar2 = 0xffff;
  if (iVar3 < 0x10000) {
    if (-1 < iVar3) goto LAB_0053dd6c;
    iVar2 = 0;
  }
  iVar3 = iVar2;
  (env->vfp).qc[0] = 1;
LAB_0053dd6c:
  return iVar3 << 0x10 | uVar4;
}

Assistant:

uint32_t HELPER(neon_uqadd_s16)(CPUARMState *env, uint32_t a, uint32_t b)
{
    int32_t va, vb, vr;
    uint64_t r = 0;

    USATACC(16, 0);
    USATACC(16, 16);
    return r;
}